

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O2

bool ImGui::SmallButtonTooltip(char *label,char *tip,ImU32 colFg,ImU32 colBg)

{
  bool bVar1;
  bool bVar2;
  ImVec2 local_30;
  
  if (colFg != 0x10101) {
    PushStyleColor(0,colFg);
  }
  if (colBg != 0x10101) {
    PushStyleColor(0x15,colBg);
  }
  local_30.x = 0.0;
  local_30.y = 0.0;
  PushStyleVar(10,&local_30);
  local_30.x = 0.0;
  local_30.y = 0.0;
  PushStyleVar(0xd,&local_30);
  bVar1 = SmallButton(label);
  PopStyleVar(2);
  if (colBg != 0x10101) {
    PopStyleColor(1);
  }
  if (colFg != 0x10101) {
    PopStyleColor(1);
  }
  if (tip != (char *)0x0) {
    bVar2 = IsItemHovered(0);
    if (bVar2) {
      SetTooltip("%s",tip);
    }
  }
  return bVar1;
}

Assistant:

IMGUI_API bool SmallButtonTooltip(const char* label,
                                  const char* tip,
                                  ImU32 colFg,
                                  ImU32 colBg)
{
    // Setup colors
    if (colFg != IM_COL32(1,1,1,0))
        PushStyleColor(ImGuiCol_Text, colFg);
    if (colBg != IM_COL32(1,1,1,0))
        PushStyleColor(ImGuiCol_Button, colBg);

    // do the button (and we _really_ using also x frame padding = 0)
    ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(0.0f,0.0f));
    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0.0f,0.0f));
    bool b = SmallButton(label);
    ImGui::PopStyleVar(2);
    
    // restore previous colors
    if (colBg != IM_COL32(1,1,1,0))
        PopStyleColor();
    if (colFg != IM_COL32(1,1,1,0))
        PopStyleColor();

    // do the tooltip
    if (tip && IsItemHovered())
        SetTooltip("%s", tip);
    
    // return if button pressed
    return b;
}